

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingLinesCase::~GeometryShaderRenderingLinesCase
          (GeometryShaderRenderingLinesCase *this)

{
  GeometryShaderRenderingLinesCase *this_local;
  
  ~GeometryShaderRenderingLinesCase(this);
  operator_delete(this,0x370);
  return;
}

Assistant:

GeometryShaderRenderingLinesCase::~GeometryShaderRenderingLinesCase()
{
	if (m_raw_array_instanced_data != NULL)
	{
		delete[] m_raw_array_instanced_data;

		m_raw_array_instanced_data = NULL;
	}

	if (m_raw_array_noninstanced_data != NULL)
	{
		delete[] m_raw_array_noninstanced_data;

		m_raw_array_noninstanced_data = NULL;
	}

	if (m_unordered_array_instanced_data != NULL)
	{
		delete[] m_unordered_array_instanced_data;

		m_unordered_array_instanced_data = NULL;
	}

	if (m_unordered_array_noninstanced_data != NULL)
	{
		delete[] m_unordered_array_noninstanced_data;

		m_unordered_array_noninstanced_data = NULL;
	}

	if (m_unordered_elements_instanced_data != NULL)
	{
		delete[] m_unordered_elements_instanced_data;

		m_unordered_elements_instanced_data = NULL;
	}

	if (m_unordered_elements_noninstanced_data != NULL)
	{
		delete[] m_unordered_elements_noninstanced_data;

		m_unordered_elements_noninstanced_data = NULL;
	}
}